

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeMapPrototype
               (DynamicObject *mapPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar2;
  JavascriptFunction *value;
  ScriptConfiguration *this_01;
  JavascriptString *value_00;
  JavascriptFunction *entriesFunc;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *mapPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,mapPrototype,mode,0xd,1);
  this = RecyclableObject::GetScriptContext(&mapPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&mapPrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).mapConstructor);
  AddMember(this_00,mapPrototype,0x67,*ppRVar2);
  AddFunctionToLibraryObject
            (this_00,mapPrototype,0x62,(FunctionInfo *)JavascriptMap::EntryInfo::Clear,0,'\x06');
  AddFunctionToLibraryObject
            (this_00,mapPrototype,0x6f,(FunctionInfo *)JavascriptMap::EntryInfo::Delete,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,mapPrototype,0x93,(FunctionInfo *)JavascriptMap::EntryInfo::ForEach,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,mapPrototype,0x198,(FunctionInfo *)JavascriptMap::EntryInfo::Get,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,mapPrototype,0xb4,(FunctionInfo *)JavascriptMap::EntryInfo::Has,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,mapPrototype,0x19b,(FunctionInfo *)JavascriptMap::EntryInfo::Set,2,'\x06');
  AddAccessorsToLibraryObject
            (this_00,mapPrototype,0x14f,(FunctionInfo *)JavascriptMap::EntryInfo::SizeGetter,
             (FunctionInfo *)0x0);
  value = AddFunctionToLibraryObject
                    (this_00,mapPrototype,0x7a,(FunctionInfo *)JavascriptMap::EntryInfo::Entries,0,
                     '\x06');
  AddFunctionToLibraryObject
            (this_00,mapPrototype,0xcf,(FunctionInfo *)JavascriptMap::EntryInfo::Keys,0,'\x06');
  AddFunctionToLibraryObject
            (this_00,mapPrototype,399,(FunctionInfo *)JavascriptMap::EntryInfo::Values,0,'\x06');
  AddMember(this_00,mapPrototype,0x14,value);
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value_00 = CreateStringFromCppLiteral<4ul>(this_00,(char16 (*) [4])0x1784f4e);
    AddMember(this_00,mapPrototype,0x1b,value_00,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(mapPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeMapPrototype(DynamicObject* mapPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(mapPrototype, mode, 13, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterMap
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = mapPrototype->GetScriptContext();
        JavascriptLibrary* library = mapPrototype->GetLibrary();
        library->AddMember(mapPrototype, PropertyIds::constructor, library->mapConstructor);

        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::clear, &JavascriptMap::EntryInfo::Clear, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::delete_, &JavascriptMap::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::forEach, &JavascriptMap::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::get, &JavascriptMap::EntryInfo::Get, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::has, &JavascriptMap::EntryInfo::Has, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::set, &JavascriptMap::EntryInfo::Set, 2);

        library->AddAccessorsToLibraryObject(mapPrototype, PropertyIds::size, &JavascriptMap::EntryInfo::SizeGetter, nullptr);

        JavascriptFunction* entriesFunc;
        entriesFunc = library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::entries, &JavascriptMap::EntryInfo::Entries, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::keys, &JavascriptMap::EntryInfo::Keys, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::values, &JavascriptMap::EntryInfo::Values, 0);
        library->AddMember(mapPrototype, PropertyIds::_symbolIterator, entriesFunc);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(mapPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Map")), PropertyConfigurable);
        }

        mapPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }